

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-diag.c
# Opt level: O0

void fy_diag_node_vreport(fy_diag *diag,fy_node *fyn,fy_error_type type,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  undefined1 local_58 [7];
  _Bool save_on_error;
  fy_diag_report_ctx drc;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_error_type type_local;
  fy_node *fyn_local;
  fy_diag *diag_local;
  
  if ((fyn != (fy_node *)0x0) && (diag != (fy_diag *)0x0)) {
    bVar1 = diag->field_0x3c;
    diag->field_0x3c = diag->field_0x3c & 0xfe;
    drc._32_8_ = ap;
    memset(local_58,0,0x28);
    stack0xffffffffffffffac = FYEM_UNKNOWN;
    local_58._0_4_ = type;
    drc._0_8_ = fy_node_token(fyn);
    fy_diag_vreport(diag,(fy_diag_report_ctx *)local_58,fmt,(__va_list_tag *)drc._32_8_);
    diag->field_0x3c = diag->field_0x3c & 0xfe | bVar1 & 1;
  }
  return;
}

Assistant:

void fy_diag_node_vreport(struct fy_diag *diag, struct fy_node *fyn,
                          enum fy_error_type type, const char *fmt, va_list ap) {
    struct fy_diag_report_ctx drc;
    bool save_on_error;

    if (!fyn || !diag)
        return;

    save_on_error = diag->on_error;
    diag->on_error = false;

    memset(&drc, 0, sizeof(drc));
    drc.type = type;
    drc.module = FYEM_UNKNOWN;
    drc.fyt = fy_node_token(fyn);
    fy_diag_vreport(diag, &drc, fmt, ap);

    diag->on_error = save_on_error;
}